

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::GetEncoderOverflow(AmpIO *this,uint index)

{
  uint32_t uVar1;
  ostream *poVar2;
  void *this_00;
  uint index_local;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x64524131) {
    this_local._7_1_ = false;
  }
  else if (index < this->NumEncoders) {
    this_local._7_1_ = (this->ReadBuffer[index + this->ENC_POS_OFFSET] & 0x1000000) != 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"AmpIO::GetEncoderOverflow: index out of range ")
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,index);
    poVar2 = std::operator<<(poVar2,", nb channels is ");
    this_00 = (void *)std::ostream::operator<<(poVar2,this->NumEncoders);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::GetEncoderOverflow(unsigned int index) const
{
    if (GetHardwareVersion() == dRA1_String)
        return false;

    if (index < NumEncoders) {
        return ReadBuffer[index+ENC_POS_OFFSET] & ENC_OVER_MASK;
    } else {
        std::cerr << "AmpIO::GetEncoderOverflow: index out of range " << index
                  << ", nb channels is " << NumEncoders << std::endl;
    }
    return true; // send error "code"
}